

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O2

int Gia_ObjFanin0CopyCarry(Vec_Int_t *vCarries,Gia_Obj_t *pObj,int Id)

{
  int iVar1;
  
  if (vCarries != (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntEntry(vCarries,Id - (*(uint *)pObj & 0x1fffffff));
    if (iVar1 != -1) {
      iVar1 = Vec_IntEntry(vCarries,Id - (*(uint *)pObj & 0x1fffffff));
      iVar1 = Abc_LitNotCond(iVar1,*(uint *)pObj >> 0x1d & 1);
      return iVar1;
    }
  }
  iVar1 = Gia_ObjFanin0Copy(pObj);
  return iVar1;
}

Assistant:

int Gia_ObjFanin0CopyCarry( Vec_Int_t * vCarries, Gia_Obj_t * pObj, int Id )
{
    if ( vCarries == NULL || Vec_IntEntry(vCarries, Gia_ObjFaninId0(pObj, Id)) == -1 )
        return Gia_ObjFanin0Copy(pObj);
    return Abc_LitNotCond( Vec_IntEntry(vCarries, Gia_ObjFaninId0(pObj, Id)), Gia_ObjFaninC0(pObj) );
}